

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

void keep_one_mv_stat(MV_STATS *mv_stats,MV *ref_mv,MV *cur_mv,AV1_COMP *cpi)

{
  short sVar1;
  byte bVar2;
  int iVar3;
  long in_RCX;
  short *in_RDX;
  short *in_RSI;
  int *in_RDI;
  AV1_COMP *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  MV_STATS *in_stack_00000010;
  int lp_rate;
  int hp_rate;
  int comp_rate;
  int rates [5];
  int lp_comp_val;
  int hp_comp_val;
  int comp_val;
  int comp_idx;
  int lp_mv_joint_rate;
  int hp_mv_joint_rate;
  int mv_joint_rate;
  int lp_mv_joint;
  MV lp_diff;
  MV truncated_diff;
  int hp_mv_joint;
  MV hp_diff;
  int mv_joint;
  MV diff;
  int use_hp;
  aom_cdf_prob *joint_cdf;
  nmv_context *nmvc;
  FRAME_CONTEXT *ec_ctx;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int local_bc;
  int local_b8;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_a8;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  MV local_64;
  short local_60;
  short sStack_5e;
  uint local_5c;
  MV local_58;
  uint local_54;
  MV local_50;
  uint local_4c;
  aom_cdf_prob *local_48;
  aom_cdf_prob *local_40;
  long local_38;
  long local_30;
  long local_28;
  
  local_28 = in_RCX + 0x15030;
  local_30 = in_RCX + 0x151d0;
  local_38 = *(long *)(in_RCX + 0x17b68);
  local_48 = (aom_cdf_prob *)(local_38 + 0x2e88);
  local_4c = (uint)(*(byte *)(in_RCX + 0x3c16d) & 1);
  local_50.row = *in_RDX - *in_RSI;
  local_50.col = in_RDX[1] - in_RSI[1];
  local_40 = local_48;
  bVar2 = av1_get_mv_joint(&local_50);
  local_54 = (uint)bVar2;
  local_58.row = local_50.row;
  local_58.col = local_50.col;
  bVar2 = av1_get_mv_joint(&local_58);
  local_5c = (uint)bVar2;
  local_60 = (short)((int)local_50.row / 2 << 1);
  sStack_5e = (short)((int)local_50.col / 2 << 1);
  local_64.row = local_60;
  local_64.col = sStack_5e;
  if (local_4c == 0) {
    local_64.row = local_50.row;
    local_64.col = local_50.col;
  }
  bVar2 = av1_get_mv_joint(&local_64);
  local_68 = (uint)bVar2;
  local_6c = get_symbol_cost((aom_cdf_prob *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
  local_70 = get_symbol_cost((aom_cdf_prob *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
  local_74 = get_symbol_cost((aom_cdf_prob *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff4c);
  update_cdf(local_48,(int8_t)local_54,4);
  in_RDI[0xc] = local_6c + in_RDI[0xc];
  in_RDI[0xd] = local_70 + in_RDI[0xd];
  in_RDI[0xe] = local_74 + in_RDI[0xe];
  in_RDI[(long)(int)local_54 + 6] = in_RDI[(long)(int)local_54 + 6] + 1;
  for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
    sVar1 = local_50.row;
    if (local_78 != 0) {
      sVar1 = local_50.col;
    }
    local_a8 = (int)sVar1;
    local_7c = local_a8;
    sVar1 = local_58.row;
    if (local_78 != 0) {
      sVar1 = local_58.col;
    }
    local_80 = (int)sVar1;
    sVar1 = local_64.row;
    if (local_78 != 0) {
      sVar1 = local_64.col;
    }
    local_84 = (int)sVar1;
    memset(&local_98,0,0x14);
    if (local_7c == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = keep_one_comp_stat(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr
                                 ,in_RDI);
    }
    if (local_80 == 0) {
      local_b8 = 0;
    }
    else {
      local_b8 = local_98 + local_94 + local_90 + local_8c + local_88;
    }
    if (local_84 == 0) {
      local_bc = 0;
    }
    else {
      local_bc = local_98 + local_94 + local_90 + local_8c;
    }
    in_RDI[0xc] = iVar3 + in_RDI[0xc];
    in_RDI[0xd] = local_b8 + in_RDI[0xd];
    in_RDI[0xe] = local_bc + in_RDI[0xe];
  }
  return;
}

Assistant:

static inline void keep_one_mv_stat(MV_STATS *mv_stats, const MV *ref_mv,
                                    const MV *cur_mv, const AV1_COMP *cpi) {
  const MACROBLOCK *const x = &cpi->td.mb;
  const MACROBLOCKD *const xd = &x->e_mbd;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  nmv_context *nmvc = &ec_ctx->nmvc;
  aom_cdf_prob *joint_cdf = nmvc->joints_cdf;
  const int use_hp = cpi->common.features.allow_high_precision_mv;

  const MV diff = { cur_mv->row - ref_mv->row, cur_mv->col - ref_mv->col };
  const int mv_joint = av1_get_mv_joint(&diff);
  // TODO(chiyotsai@google.com): Estimate hp_diff when we are using lp
  const MV hp_diff = diff;
  const int hp_mv_joint = av1_get_mv_joint(&hp_diff);
  const MV truncated_diff = { (diff.row / 2) * 2, (diff.col / 2) * 2 };
  const MV lp_diff = use_hp ? truncated_diff : diff;
  const int lp_mv_joint = av1_get_mv_joint(&lp_diff);

  const int mv_joint_rate = get_symbol_cost(joint_cdf, mv_joint);
  const int hp_mv_joint_rate = get_symbol_cost(joint_cdf, hp_mv_joint);
  const int lp_mv_joint_rate = get_symbol_cost(joint_cdf, lp_mv_joint);

  update_cdf(joint_cdf, mv_joint, MV_JOINTS);

  mv_stats->total_mv_rate += mv_joint_rate;
  mv_stats->hp_total_mv_rate += hp_mv_joint_rate;
  mv_stats->lp_total_mv_rate += lp_mv_joint_rate;
  mv_stats->mv_joint_count[mv_joint]++;

  for (int comp_idx = 0; comp_idx < 2; comp_idx++) {
    const int comp_val = comp_idx ? diff.col : diff.row;
    const int hp_comp_val = comp_idx ? hp_diff.col : hp_diff.row;
    const int lp_comp_val = comp_idx ? lp_diff.col : lp_diff.row;
    int rates[5];
    av1_zero_array(rates, 5);

    const int comp_rate =
        comp_val ? keep_one_comp_stat(mv_stats, comp_val, comp_idx, cpi, rates)
                 : 0;
    // TODO(chiyotsai@google.com): Properly get hp rate when use_hp is false
    const int hp_rate =
        hp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] + rates[4] : 0;
    const int lp_rate =
        lp_comp_val ? rates[0] + rates[1] + rates[2] + rates[3] : 0;

    mv_stats->total_mv_rate += comp_rate;
    mv_stats->hp_total_mv_rate += hp_rate;
    mv_stats->lp_total_mv_rate += lp_rate;
  }
}